

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<double,4,1,0,4,1>,Eigen::CwiseNullaryOp<C_A_T_C_H_T_E_S_T_0()::__0,Eigen::Matrix<double,4,1,0,4,1>>,double,double>
               (Matrix<double,_4,_1,_0,_4,_1> *dst,
               CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
               *src,assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  *src_local;
  Matrix<double,_4,_1,_0,_4,_1> *dst_local;
  
  IVar1 = CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          ::rows(src);
  cols = CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
         ::cols(src);
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>);
    if (IVar2 == cols) goto LAB_0014a33d;
  }
  PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,IVar1,cols);
LAB_0014a33d:
  IVar2 = PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, 4, 1>, SrcXprType = Eigen::CwiseNullaryOp<(lambda at /workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17), Eigen::Matrix<double, 4, 1>>, T1 = double, T2 = double]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}